

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localization.cpp
# Opt level: O0

bool __thiscall
CLocalizationDatabase::Load
          (CLocalizationDatabase *this,char *pFilename,IStorage *pStorage,IConsole *pConsole)

{
  int iVar1;
  long lVar2;
  json_value *pjVar3;
  _json_value *this_00;
  _json_value *p_Var4;
  CLocalizationDatabase *this_01;
  char *pcVar5;
  long *in_RCX;
  long *in_RDX;
  char *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  char *pTr;
  char *pOr;
  bool Valid;
  uint i;
  json_value *rStart;
  json_value *pJsonData;
  char *pFileData;
  int FileSize;
  IOHANDLE File;
  json_settings JsonSettings;
  char aError [256];
  char aBuf [256];
  json_value *value;
  array<CLocalizationDatabase::CString,_allocator_default<CLocalizationDatabase::CString>_>
  *in_stack_fffffffffffffd20;
  array<CLocalizationDatabase::CString,_allocator_default<CLocalizationDatabase::CString>_> *this_02
  ;
  undefined7 in_stack_fffffffffffffd28;
  undefined1 in_stack_fffffffffffffd2f;
  char *in_stack_fffffffffffffd48;
  undefined5 in_stack_fffffffffffffd50;
  undefined1 in_stack_fffffffffffffd55;
  undefined1 in_stack_fffffffffffffd56;
  undefined1 uVar6;
  char *local_298;
  uint local_28c;
  undefined7 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc7;
  bool bVar7;
  size_t in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  json_settings *in_stack_fffffffffffffdd8;
  undefined1 local_208 [256];
  char local_108 [256];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*in_RSI == '\0') {
    array<CLocalizationDatabase::CString,_allocator_default<CLocalizationDatabase::CString>_>::clear
              (in_stack_fffffffffffffd20);
    in_RDI[0x14] = '\0';
    in_RDI[0x15] = '\0';
    in_RDI[0x16] = '\0';
    in_RDI[0x17] = '\0';
    bVar7 = true;
  }
  else {
    value = (json_value *)0x0;
    this_02 = (array<CLocalizationDatabase::CString,_allocator_default<CLocalizationDatabase::CString>_>
               *)0x0;
    lVar2 = (**(code **)(*in_RDX + 0x20))(in_RDX,in_RSI,1,0xffffffff,0,0);
    if (lVar2 == 0) {
      bVar7 = false;
    }
    else {
      io_length((IOHANDLE)this_02);
      mem_alloc(0);
      io_read((IOHANDLE)this_02,value,0);
      io_close((IOHANDLE)0x1d5f55);
      str_format(local_108,0x100,"loaded \'%s\'",in_RSI);
      (**(code **)(*in_RCX + 200))(in_RCX,1,"localization",local_108,0);
      array<CLocalizationDatabase::CString,_allocator_default<CLocalizationDatabase::CString>_>::
      clear(this_02);
      mem_zero(this_02,(uint)((ulong)value >> 0x20));
      pjVar3 = json_parse_ex(in_stack_fffffffffffffdd8,
                             (char *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                             in_stack_fffffffffffffdc8,
                             (char *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
      mem_free((void *)0x1d5fea);
      if (pjVar3 == (json_value *)0x0) {
        (**(code **)(*in_RCX + 200))(in_RCX,1,in_RSI,local_208,0);
        bVar7 = false;
      }
      else {
        this_00 = _json_value::operator[]
                            ((_json_value *)
                             CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
                             (char *)this_02);
        if (this_00->type == json_array) {
          for (local_28c = 0; local_28c < (this_00->u).string.length; local_28c = local_28c + 1) {
            bVar7 = true;
            _json_value::operator[](this_00,local_28c);
            p_Var4 = _json_value::operator[]
                               ((_json_value *)
                                CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
                                (char *)this_02);
            local_298 = _json_value::operator_cast_to_char_(p_Var4);
            _json_value::operator[](this_00,local_28c);
            p_Var4 = _json_value::operator[]
                               ((_json_value *)
                                CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
                                (char *)this_02);
            this_01 = (CLocalizationDatabase *)_json_value::operator_cast_to_char_(p_Var4);
            while( true ) {
              uVar6 = false;
              if (*local_298 != '\0') {
                uVar6 = *(char *)&(this_01->m_Strings).
                                  super_array<CLocalizationDatabase::CString,_allocator_default<CLocalizationDatabase::CString>_>
                                  .list != '\0';
              }
              if ((bool)uVar6 == false) goto LAB_001d62f9;
              while( true ) {
                in_stack_fffffffffffffd56 = false;
                if (*local_298 != '\0') {
                  in_stack_fffffffffffffd56 = *local_298 != '%';
                }
                if ((bool)in_stack_fffffffffffffd56 == false) break;
                local_298 = local_298 + 1;
              }
              while( true ) {
                in_stack_fffffffffffffd55 = false;
                if (*(char *)&(this_01->m_Strings).
                              super_array<CLocalizationDatabase::CString,_allocator_default<CLocalizationDatabase::CString>_>
                              .list != '\0') {
                  in_stack_fffffffffffffd55 =
                       *(char *)&(this_01->m_Strings).
                                 super_array<CLocalizationDatabase::CString,_allocator_default<CLocalizationDatabase::CString>_>
                                 .list != '%';
                }
                if ((bool)in_stack_fffffffffffffd55 == false) break;
                this_01 = (CLocalizationDatabase *)
                          ((long)&(this_01->m_Strings).
                                  super_array<CLocalizationDatabase::CString,_allocator_default<CLocalizationDatabase::CString>_>
                                  .list + 1);
              }
              if (((*local_298 != '\0') &&
                  (*(char *)&(this_01->m_Strings).
                             super_array<CLocalizationDatabase::CString,_allocator_default<CLocalizationDatabase::CString>_>
                             .list != '\0')) &&
                 (((local_298[1] == ' ' &&
                   (*(char *)((long)&(this_01->m_Strings).
                                     super_array<CLocalizationDatabase::CString,_allocator_default<CLocalizationDatabase::CString>_>
                                     .list + 1) == '\0')) ||
                  ((local_298[1] == '\0' &&
                   (*(char *)((long)&(this_01->m_Strings).
                                     super_array<CLocalizationDatabase::CString,_allocator_default<CLocalizationDatabase::CString>_>
                                     .list + 1) == ' ')))))) goto LAB_001d62f9;
              if (((*local_298 != '\0') &&
                  ((*(char *)&(this_01->m_Strings).
                              super_array<CLocalizationDatabase::CString,_allocator_default<CLocalizationDatabase::CString>_>
                              .list == '\0' ||
                   (local_298[1] !=
                    *(char *)((long)&(this_01->m_Strings).
                                     super_array<CLocalizationDatabase::CString,_allocator_default<CLocalizationDatabase::CString>_>
                                     .list + 1))))) ||
                 ((*(char *)&(this_01->m_Strings).
                             super_array<CLocalizationDatabase::CString,_allocator_default<CLocalizationDatabase::CString>_>
                             .list != '\0' &&
                  ((*local_298 == '\0' ||
                   (*(char *)((long)&(this_01->m_Strings).
                                     super_array<CLocalizationDatabase::CString,_allocator_default<CLocalizationDatabase::CString>_>
                                     .list + 1) != local_298[1])))))) break;
              if (*local_298 != '\0') {
                local_298 = local_298 + 1;
              }
              if (*(char *)&(this_01->m_Strings).
                            super_array<CLocalizationDatabase::CString,_allocator_default<CLocalizationDatabase::CString>_>
                            .list != '\0') {
                this_01 = (CLocalizationDatabase *)
                          ((long)&(this_01->m_Strings).
                                  super_array<CLocalizationDatabase::CString,_allocator_default<CLocalizationDatabase::CString>_>
                                  .list + 1);
              }
            }
            bVar7 = false;
            _json_value::operator[](this_00,local_28c);
            p_Var4 = _json_value::operator[]
                               ((_json_value *)
                                CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
                                (char *)this_02);
            in_stack_fffffffffffffd48 = _json_value::operator_cast_to_char_(p_Var4);
            _json_value::operator[](this_00,local_28c);
            p_Var4 = _json_value::operator[]
                               ((_json_value *)
                                CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
                                (char *)this_02);
            pcVar5 = _json_value::operator_cast_to_char_(p_Var4);
            str_format(local_108,0x100,"skipping invalid entry or:\'%s\', tr:\'%s\'",
                       in_stack_fffffffffffffd48,pcVar5);
            (**(code **)(*in_RCX + 200))(in_RCX,1,"localization",local_108,0);
LAB_001d62f9:
            if (bVar7) {
              _json_value::operator[](this_00,local_28c);
              p_Var4 = _json_value::operator[]
                                 ((_json_value *)
                                  CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
                                  (char *)this_02);
              _json_value::operator_cast_to_char_(p_Var4);
              _json_value::operator[](this_00,local_28c);
              p_Var4 = _json_value::operator[]
                                 ((_json_value *)
                                  CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
                                  (char *)this_02);
              _json_value::operator_cast_to_char_(p_Var4);
              _json_value::operator[](this_00,local_28c);
              p_Var4 = _json_value::operator[]
                                 ((_json_value *)
                                  CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
                                  (char *)this_02);
              _json_value::operator_cast_to_char_(p_Var4);
              AddString(this_01,in_RDI,
                        (char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd56,
                                                        CONCAT15(in_stack_fffffffffffffd55,
                                                                 in_stack_fffffffffffffd50))),
                        in_stack_fffffffffffffd48);
            }
          }
        }
        json_value_free(value);
        iVar1 = *(int *)(in_RDI + 0x10);
        *(int *)(in_RDI + 0x10) = iVar1 + 1;
        *(int *)(in_RDI + 0x14) = iVar1 + 1;
        bVar7 = true;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return bVar7;
}

Assistant:

bool CLocalizationDatabase::Load(const char *pFilename, IStorage *pStorage, IConsole *pConsole)
{
	// empty string means unload
	if(pFilename[0] == 0)
	{
		m_Strings.clear();
		m_CurrentVersion = 0;
		return true;
	}

	// read file data into buffer
	IOHANDLE File = pStorage->OpenFile(pFilename, IOFLAG_READ, IStorage::TYPE_ALL);
	if(!File)
		return false;
	int FileSize = (int)io_length(File);
	char *pFileData = (char *)mem_alloc(FileSize);
	io_read(File, pFileData, FileSize);
	io_close(File);

	// init
	char aBuf[256];
	str_format(aBuf, sizeof(aBuf), "loaded '%s'", pFilename);
	pConsole->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "localization", aBuf);
	m_Strings.clear();

	// parse json data
	json_settings JsonSettings;
	mem_zero(&JsonSettings, sizeof(JsonSettings));
	char aError[256];
	json_value *pJsonData = json_parse_ex(&JsonSettings, pFileData, FileSize, aError);
	mem_free(pFileData);
	
	if(pJsonData == 0)
	{
		pConsole->Print(IConsole::OUTPUT_LEVEL_ADDINFO, pFilename, aError);
		return false;
	}

	// extract data
	const json_value &rStart = (*pJsonData)["translated strings"];
	if(rStart.type == json_array)
	{
		for(unsigned i = 0; i < rStart.u.array.length; ++i)
		{
			bool Valid = true;
			const char *pOr = (const char *)rStart[i]["or"];
			const char *pTr = (const char *)rStart[i]["tr"];
			while(pOr[0] && pTr[0])
			{
				for(; pOr[0] && pOr[0] != '%'; ++pOr);
				for(; pTr[0] && pTr[0] != '%'; ++pTr);
				if(pOr[0] && pTr[0] && ((pOr[1] == ' ' && pTr[1] == 0) || (pOr[1] == 0 && pTr[1] == ' ')))	// skip  false positive
					break;
				if((pOr[0] && (!pTr[0] || pOr[1] != pTr[1])) || (pTr[0] && (!pOr[0] || pTr[1] != pOr[1])))
				{
					Valid = false;
					str_format(aBuf, sizeof(aBuf), "skipping invalid entry or:'%s', tr:'%s'", (const char *)rStart[i]["or"], (const char *)rStart[i]["tr"]);
					pConsole->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "localization", aBuf);
					break;
				}
				if(pOr[0])
					++pOr;
				if(pTr[0])
					++pTr;
			}
			if(Valid)
				AddString((const char *)rStart[i]["or"], (const char *)rStart[i]["tr"], (const char *)rStart[i]["context"]);
		}
	}

	// clean up
	json_value_free(pJsonData);
	m_CurrentVersion = ++m_VersionCounter;
	return true;
}